

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * Curl_checkProxyheaders(Curl_easy *data,connectdata *conn,char *thisheader)

{
  int iVar1;
  size_t max;
  curl_slist *local_40;
  size_t thislen;
  curl_slist *head;
  char *thisheader_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  max = strlen(thisheader);
  if (((*(ulong *)&(conn->bits).field_0x4 >> 10 & 1) == 0) ||
     ((*(ulong *)&(data->set).field_0x9a0 >> 4 & 1) == 0)) {
    local_40 = (data->set).headers;
  }
  else {
    local_40 = (data->set).proxyheaders;
  }
  thislen = (size_t)local_40;
  while( true ) {
    if (thislen == 0) {
      return (char *)0x0;
    }
    iVar1 = Curl_strncasecompare(*(char **)thislen,thisheader,max);
    if ((iVar1 != 0) &&
       ((*(char *)(*(long *)thislen + max) == ':' || (*(char *)(*(long *)thislen + max) == ';'))))
    break;
    thislen = *(size_t *)(thislen + 8);
  }
  return *(char **)thislen;
}

Assistant:

char *Curl_checkProxyheaders(struct Curl_easy *data,
                             const struct connectdata *conn,
                             const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);

  for(head = (conn->bits.proxy && data->set.sep_headers) ?
        data->set.proxyheaders : data->set.headers;
      head; head = head->next) {
    if(strncasecompare(head->data, thisheader, thislen) &&
       Curl_headersep(head->data[thislen]))
      return head->data;
  }

  return NULL;
}